

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::
PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PointeeMatcher<int>,testing::internal::PointeeMatcher<int>>>>
::operator()(void *this,char *value_text,
            parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>
            *x)

{
  bool bVar1;
  UnorderedElementsAreMatcherImpl<phmap::parallel_flat_hash_set<std::unique_ptr<int,std::default_delete<int>>,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>,4ul,phmap::NullMutex>const&>
  *this_00;
  ostream *poVar2;
  AssertionResult *other;
  parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>
  *in_RCX;
  __normal_iterator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_*,_std::vector<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>_>
  last;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar3;
  AssertionResult local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  Matcher<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
  matcher;
  StringMatchResultListener listener;
  stringstream ss;
  ostream local_198 [376];
  
  listener.super_MatchResultListener._vptr_MatchResultListener = (_func_int **)0x0;
  listener.super_MatchResultListener.stream_ = (ostream *)0x0;
  listener.ss_ = (stringstream)0x0;
  listener._17_7_ = 0;
  last._M_current = (Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&> *)in_RCX;
  std::
  vector<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
  ::reserve((vector<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
             *)&listener,2);
  TransformTupleValuesHelper<std::tuple<testing::internal::PointeeMatcher<int>,_testing::internal::PointeeMatcher<int>_>,_testing::internal::CastAndAppendTransform<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>_>_>
  ::Run(value_text,&listener);
  this_00 = (UnorderedElementsAreMatcherImpl<phmap::parallel_flat_hash_set<std::unique_ptr<int,std::default_delete<int>>,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>,4ul,phmap::NullMutex>const&>
             *)operator_new(0x40);
  UnorderedElementsAreMatcherImpl<phmap::parallel_flat_hash_set<std::unique_ptr<int,std::default_delete<int>>,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>,4ul,phmap::NullMutex>const&>
  ::
  UnorderedElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<std::unique_ptr<int,std::default_delete<int>>const&>*,std::vector<testing::Matcher<std::unique_ptr<int,std::default_delete<int>>const&>,std::allocator<testing::Matcher<std::unique_ptr<int,std::default_delete<int>>const&>>>>>
            (this_00,(Flags)listener.super_MatchResultListener._vptr_MatchResultListener,
             (__normal_iterator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_*,_std::vector<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>_>
              )listener.super_MatchResultListener.stream_,last);
  Matcher<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
  ::Matcher(&matcher,(MatcherInterface<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
                      *)this_00);
  std::
  vector<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
  ::~vector((vector<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>
             *)&listener);
  bVar1 = MatcherBase<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
          ::Matches(&matcher.
                     super_MatcherBase<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
                    ,in_RCX);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar2 = std::operator<<(local_198,"Value of: ");
    poVar2 = std::operator<<(poVar2,(char *)x);
    poVar2 = std::operator<<(poVar2,"\n");
    std::operator<<(poVar2,"Expected: ");
    MatcherBase<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
    ::DescribeTo(&matcher.
                  super_MatcherBase<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
                 ,local_198);
    StringMatchResultListener::StringMatchResultListener(&listener);
    bVar1 = MatchPrintAndExplain<phmap::parallel_flat_hash_set<std::unique_ptr<int,std::default_delete<int>>,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>,4ul,phmap::NullMutex>const,phmap::parallel_flat_hash_set<std::unique_ptr<int,std::default_delete<int>>,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>,4ul,phmap::NullMutex>const&>
                      (in_RCX,&matcher,&listener.super_MatchResultListener);
    if (bVar1) {
      std::operator<<(local_198,
                      "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                     );
    }
    poVar2 = std::operator<<(local_198,"\n  Actual: ");
    std::__cxx11::stringbuf::str();
    std::operator<<(poVar2,(string *)&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    AssertionFailure();
    std::__cxx11::stringbuf::str();
    other = AssertionResult::operator<<(&local_390,&local_380);
    AssertionResult::AssertionResult((AssertionResult *)this,other);
    std::__cxx11::string::~string((string *)&local_380);
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&local_390.message_);
    StringMatchResultListener::~StringMatchResultListener(&listener);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  MatcherBase<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
  ::~MatcherBase(&matcher.
                  super_MatcherBase<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
                );
  AVar3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult operator()(const char* value_text, const T& x) const {
    // We convert matcher_ to a Matcher<const T&> *now* instead of
    // when the PredicateFormatterFromMatcher object was constructed,
    // as matcher_ may be polymorphic (e.g. NotNull()) and we won't
    // know which type to instantiate it to until we actually see the
    // type of x here.
    //
    // We write SafeMatcherCast<const T&>(matcher_) instead of
    // Matcher<const T&>(matcher_), as the latter won't compile when
    // matcher_ has type Matcher<T> (e.g. An<int>()).
    // We don't write MatcherCast<const T&> either, as that allows
    // potentially unsafe downcasting of the matcher argument.
    const Matcher<const T&> matcher = SafeMatcherCast<const T&>(matcher_);

    // The expected path here is that the matcher should match (i.e. that most
    // tests pass) so optimize for this case.
    if (matcher.Matches(x)) {
      return AssertionSuccess();
    }

    ::std::stringstream ss;
    ss << "Value of: " << value_text << "\n"
       << "Expected: ";
    matcher.DescribeTo(&ss);

    // Rerun the matcher to "PrintAndExplain" the failure.
    StringMatchResultListener listener;
    if (MatchPrintAndExplain(x, matcher, &listener)) {
      ss << "\n  The matcher failed on the initial attempt; but passed when "
            "rerun to generate the explanation.";
    }
    ss << "\n  Actual: " << listener.str();
    return AssertionFailure() << ss.str();
  }